

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O2

void __thiscall
QLibraryPrivate::QLibraryPrivate
          (QLibraryPrivate *this,QString *canonicalFileName,QString *version,LoadHints loadHints)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)this,&canonicalFileName->d);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->fullVersion).d,&version->d);
  (this->inst).wp.value = (QObject *)0x0;
  (this->metaData).data.n = 0;
  (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  (this->inst).wp.d = (Data *)0x0;
  (this->instanceFactory).super_QBasicAtomicPointer<QObject_*()>._q_value._M_b._M_p =
       (__pointer_type)0x0;
  (this->pHnd).super_QBasicAtomicPointer<void>._q_value._M_b._M_p = (__pointer_type)0x0;
  (this->metaData).data.container = (QCborContainerPrivate *)0x0;
  (this->metaData).data.t = Undefined;
  (this->errorString).d.d = (Data *)0x0;
  (this->errorString).d.ptr = (char16_t *)0x0;
  (this->errorString).d.size = 0;
  (this->qualifiedFileName).d.d = (Data *)0x0;
  (this->qualifiedFileName).d.ptr = (char16_t *)0x0;
  (this->qualifiedFileName).d.size = 0;
  *(undefined8 *)((long)&(this->qualifiedFileName).d.size + 4) = 0;
  this->libraryRefCount = (QAtomicInteger<int>)0x0;
  this->libraryUnloadCount = (QAtomicInteger<int>)0x0;
  this->pluginState = MightBeAPlugin;
  (this->loadHintsInt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (__int_type_conflict)
       loadHints.super_QFlagsStorageHelper<QLibrary::LoadHint,_4>.
       super_QFlagsStorage<QLibrary::LoadHint>.i;
  if ((canonicalFileName->d).size == 0) {
    QLibrary::tr((QString *)&local_58,"The shared library was not found.",(char *)0x0,-1);
    pDVar2 = (this->errorString).d.d;
    pcVar3 = (this->errorString).d.ptr;
    (this->errorString).d.d = local_58.d;
    (this->errorString).d.ptr = local_58.ptr;
    qVar1 = (this->errorString).d.size;
    (this->errorString).d.size = local_58.size;
    local_58.d = pDVar2;
    local_58.ptr = pcVar3;
    local_58.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QLibraryPrivate::QLibraryPrivate(const QString &canonicalFileName, const QString &version, QLibrary::LoadHints loadHints)
    : fileName(canonicalFileName), fullVersion(version), pluginState(MightBeAPlugin)
{
    loadHintsInt.storeRelaxed(loadHints.toInt());
    if (canonicalFileName.isEmpty())
        errorString = QLibrary::tr("The shared library was not found.");
}